

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

uint32 google::protobuf::compiler::cpp::ParseLoopGenerator::ExpectedTag
                 (FieldDescriptor *field,uint32 *fallback_tag_ptr)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  LogMessage *other;
  uint32 uVar4;
  uint uVar5;
  FieldDescriptor *local_68;
  LogMessage local_60;
  
  if (*(int *)(field + 0x3c) == 3) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_60._0_8_ = FieldDescriptor::TypeOnceInit;
      local_68 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_60,
                 &local_68);
    }
    uVar3 = *(uint *)(field + 0x38);
    if (uVar3 - 0xd < 0xfffffffc) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_60._0_8_ = FieldDescriptor::TypeOnceInit;
        local_68 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_60,
                   &local_68);
        uVar3 = *(uint *)(field + 0x38);
      }
      uVar3 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)uVar3 * 4);
      iVar1 = *(int *)(field + 0x44);
      uVar5 = iVar1 << 3;
      if (uVar3 == 2) {
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
                   ,0x6a8);
        other = internal::LogMessage::operator<<
                          (&local_60,
                           "CHECK failed: expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED: "
                          );
        internal::LogFinisher::operator=((LogFinisher *)&local_68,other);
        internal::LogMessage::~LogMessage(&local_60);
        uVar5 = *(int *)(field + 0x44) << 3;
      }
      uVar4 = iVar1 << 3 | uVar3;
      bVar2 = FieldDescriptor::is_packed(field);
      uVar3 = uVar5 | 2;
      if (bVar2) {
        uVar3 = uVar4;
        uVar4 = uVar5 | 2;
      }
      *fallback_tag_ptr = uVar3;
      return uVar4;
    }
  }
  bVar2 = FieldDescriptor::is_packed(field);
  uVar3 = 2;
  if (!bVar2) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_60._0_8_ = FieldDescriptor::TypeOnceInit;
      local_68 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_60,
                 &local_68);
    }
    uVar3 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)*(uint *)(field + 0x38) * 4);
  }
  return *(int *)(field + 0x44) << 3 | uVar3;
}

Assistant:

static uint32 ExpectedTag(const FieldDescriptor* field,
                            uint32* fallback_tag_ptr) {
    uint32 expected_tag;
    if (field->is_packable()) {
      auto expected_wiretype = WireFormat::WireTypeForFieldType(field->type());
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
      GOOGLE_CHECK(expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      auto fallback_wiretype = WireFormatLite::WIRETYPE_LENGTH_DELIMITED;
      uint32 fallback_tag =
          WireFormatLite::MakeTag(field->number(), fallback_wiretype);

      if (field->is_packed()) std::swap(expected_tag, fallback_tag);
      *fallback_tag_ptr = fallback_tag;
    } else {
      auto expected_wiretype = WireFormat::WireTypeForField(field);
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
    }
    return expected_tag;
  }